

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O3

adios2_error adios2_attribute_name(char *name,size_t *size,adios2_attribute *attribute)

{
  ulong uVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"for attribute, in call to adios2_attribute_name","");
  adios2::helper::CheckForNullptr<adios2_attribute_const>(attribute,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  uVar1 = *(ulong *)(attribute + 0x10);
  *size = uVar1;
  if (name != (char *)0x0) {
    std::__cxx11::string::copy((char *)(attribute + 8),(ulong)name,uVar1);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_attribute_name(char *name, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute,
                                        "for attribute, in call to adios2_attribute_name");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        return String2CAPI(attributeBase->m_Name, name, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_name"));
    }
}